

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O3

void __thiscall
clunk::Node::GetSliderCaptures(Node *this,Color color,MoveType type,uint64_t mvs,int from)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  uint32_t uVar4;
  byte *pbVar5;
  bool bVar6;
  uint uVar7;
  uint to;
  long lVar8;
  int iVar9;
  long lVar10;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6b2,
                  "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6b3,
                  "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  pbVar5 = (byte *)(&_board)[(uint)from];
  if (pbVar5 == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6b4,
                  "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((color | type) == (uint)*pbVar5) {
    if ((uint)pbVar5[1] != from) {
      __assert_fail("_board[from]->sqr == from",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x6b6,
                    "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                   );
    }
    uVar7 = GetPinDir(this,color,from);
    if (mvs != 0) {
      lVar10 = (ulong)(uint)from * 0x80;
      do {
        if ((mvs & 0xff) != 0) {
          to = (int)(mvs & 0xff) - 1;
          if ((to & 0xffffff88) != 0) {
            __assert_fail("IS_SQUARE(to)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x107,"int clunk::Direction(const int, const int)");
          }
          bVar1 = (&_dir)[(ulong)to + lVar10];
          if (((0x11 < bVar1) || ((0x38002U >> (bVar1 & 0x1f) & 1) == 0)) &&
             ((0x10 < bVar1 - 0xef || ((0x10007U >> (bVar1 - 0xef & 0x1f) & 1) == 0)))) {
            __assert_fail("IS_DIR(dir)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x6bd,
                          "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                         );
          }
          if ((uVar7 == 0) || (uVar7 == (byte)((bVar1 ^ (char)bVar1 >> 7) - ((char)bVar1 >> 7)))) {
            bVar1 = *(byte *)(&_board)[to];
            if ((bVar1 == 0) && ((byte *)(&_board)[to] != _EMPTY)) {
              __assert_fail("cap || (_board[to] == _EMPTY)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x6c0,
                            "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                           );
            }
            if ((~(bVar1 ^ color) & 1) == 0 && bVar1 != 0) {
              if (9 < bVar1 - 2) {
                __assert_fail("!pc || IS_CAP(pc)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x114,"int clunk::ValueOf(const int)");
              }
              uVar3 = this->moveCount;
              lVar8 = (long)(int)uVar3;
              if (lVar8 < 0) {
                __assert_fail("moveCount >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x60d,
                              "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                             );
              }
              if (0x7e < uVar3) {
                __assert_fail("(moveCount + 1) < MaxMoves",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x60e,
                              "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                             );
              }
              iVar9 = *(int *)(_VALUE_OF + (ulong)(uint)bVar1 * 4);
              cVar2 = (&_dist)[(ulong)to + lVar10];
              this->moveCount = uVar3 + 1;
              Move::Set(this->moves + lVar8,type,from,to,(uint)bVar1,0,
                        iVar9 - ((int)cVar2 + type * 8));
              uVar4 = this->moves[lVar8].bits;
              iVar9 = 0;
              if (uVar4 == this->killer[1].bits) {
                iVar9 = 0x32;
              }
              if (uVar4 == this->killer[0].bits) {
                iVar9 = 0x32;
              }
              Move::IncScore(this->moves + lVar8,iVar9);
            }
          }
        }
        bVar6 = 0xff < mvs;
        mvs = mvs >> 8;
      } while (bVar6);
    }
    return;
  }
  __assert_fail("_board[from]->type == (color|type)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                ,0x6b5,
                "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
               );
}

Assistant:

void GetSliderCaptures(const Color color, const MoveType type,
                         uint64_t mvs, const int from)
  {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|type));
    assert(_board[from]->sqr == from);
    const int pinDir = GetPinDir(color, from);
    int score;
    while (mvs) {
      if (mvs & 0xFF) {
        const int to = ((mvs & 0xFF) - 1);
        const int dir = (Direction(from, to));
        assert(IS_DIR(dir));
        if (!pinDir || (abs(dir) == pinDir)) {
          const int cap = _board[to]->type;
          assert(cap || (_board[to] == _EMPTY));
          if ((cap != 0) & (COLOR(cap) != color)) {
            score = (ValueOf(cap) - Distance(from, to) - (8 * type));
            AddMove(type, from, to, score, cap);
          }
        }
      }
      mvs >>= 8;
    }
  }